

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O1

double ON_SolveNxN(bool bFullPivot,bool bNormalize,int n,double **M,double *B,double *X)

{
  undefined4 uVar1;
  double *pdVar2;
  double *pdVar3;
  bool bVar4;
  ulong uVar5;
  undefined1 *memblock;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  int Xdex_buffer [64];
  undefined1 local_138 [264];
  
  dVar17 = 0.0;
  if ((X != (double *)0x0 && 0 < n) && (B != (double *)0x0 && M != (double **)0x0)) {
    uVar16 = (ulong)(uint)n;
    if (bNormalize) {
      uVar15 = 0;
      do {
        dVar17 = 0.0;
        if (0 < n) {
          uVar7 = 0;
          do {
            dVar17 = dVar17 + M[uVar15][uVar7] * M[uVar15][uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar16 != uVar7);
        }
        if (0.0 < dVar17) {
          if (dVar17 < 0.0) {
            dVar17 = sqrt(dVar17);
          }
          else {
            dVar17 = SQRT(dVar17);
          }
          B[uVar15] = B[uVar15] * (1.0 / dVar17);
          if (0 < n) {
            pdVar2 = M[uVar15];
            uVar7 = 0;
            do {
              pdVar2[uVar7] = pdVar2[uVar7] * (1.0 / dVar17);
              uVar7 = uVar7 + 1;
            } while (uVar16 != uVar7);
          }
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar16);
    }
    if (bFullPivot) {
      if (n < 0x41) {
        memblock = local_138;
      }
      else {
        memblock = (undefined1 *)onmalloc(uVar16 * 4);
      }
      if (0 < n) {
        uVar15 = 0;
        do {
          *(int *)(memblock + uVar15 * 4) = (int)uVar15;
          uVar15 = uVar15 + 1;
        } while (uVar16 != uVar15);
      }
    }
    else {
      memblock = (undefined1 *)0x0;
    }
    if (n < 1) {
      dVar20 = 1.0;
      dVar17 = 0.0;
    }
    else {
      uVar6 = 1;
      lVar8 = 0;
      dVar20 = 1.0;
      uVar15 = uVar16;
      uVar7 = 0;
      dVar19 = 0.0;
      do {
        uVar12 = uVar7 & 0xffffffff;
        uVar9 = uVar7;
        uVar14 = uVar7;
        dVar17 = 0.0;
        uVar13 = uVar7;
        do {
          dVar18 = ABS(M[uVar14][uVar13]);
          uVar5 = uVar9;
          if (dVar17 < dVar18) {
            uVar12 = uVar14 & 0xffffffff;
            uVar5 = uVar13;
          }
          uVar9 = uVar5 & 0xffffffff;
          if (dVar18 <= dVar17) {
            dVar18 = dVar17;
          }
          uVar14 = uVar14 + 1;
          dVar17 = dVar18;
        } while ((uVar16 != uVar14) ||
                ((bFullPivot && (uVar13 = uVar13 + 1, uVar14 = uVar7, uVar13 < uVar16))));
        if ((dVar18 == 0.0) && (!NAN(dVar18))) {
          if (memblock != local_138 && memblock != (undefined1 *)0x0) {
            onfree(memblock);
          }
          return (double)-(int)uVar7;
        }
        if ((uVar7 == 0) || ((dVar19 <= dVar18 && (dVar17 = dVar19, dVar20 < dVar18)))) {
          dVar20 = dVar18;
        }
        iVar11 = (int)uVar12;
        if (uVar7 != uVar12) {
          pdVar2 = M[uVar7];
          M[uVar7] = M[iVar11];
          M[iVar11] = pdVar2;
          dVar19 = B[uVar7];
          B[uVar7] = B[iVar11];
          B[iVar11] = dVar19;
        }
        if (uVar7 != (uVar5 & 0xffffffff)) {
          lVar10 = (long)(int)uVar5;
          uVar12 = 0;
          do {
            pdVar2 = M[uVar12];
            dVar19 = pdVar2[uVar7];
            pdVar2[uVar7] = pdVar2[lVar10];
            pdVar2[lVar10] = dVar19;
            uVar12 = uVar12 + 1;
          } while (uVar16 != uVar12);
          uVar1 = *(undefined4 *)(memblock + uVar7 * 4);
          *(undefined4 *)(memblock + uVar7 * 4) = *(undefined4 *)(memblock + lVar10 * 4);
          *(undefined4 *)(memblock + lVar10 * 4) = uVar1;
        }
        pdVar2 = M[uVar7];
        dVar19 = pdVar2[uVar7];
        B[uVar7] = B[uVar7] * (1.0 / dVar19);
        uVar12 = uVar7 + 1;
        if (uVar12 < uVar16) {
          uVar9 = 1;
          do {
            *(double *)((long)pdVar2 + uVar9 * 8 + lVar8) =
                 *(double *)((long)pdVar2 + uVar9 * 8 + lVar8) * (1.0 / dVar19);
            uVar9 = uVar9 + 1;
          } while (uVar15 != uVar9);
        }
        uVar9 = uVar6;
        if (uVar12 < uVar16) {
          do {
            pdVar3 = M[uVar9];
            dVar19 = pdVar3[uVar7];
            dVar18 = -dVar19;
            if ((dVar19 != dVar18) || (NAN(dVar19) || NAN(dVar18))) {
              B[uVar9] = B[uVar7] * dVar18 + B[uVar9];
              uVar14 = 1;
              do {
                *(double *)((long)pdVar3 + uVar14 * 8 + lVar8) =
                     *(double *)((long)pdVar2 + uVar14 * 8 + lVar8) * dVar18 +
                     *(double *)((long)pdVar3 + uVar14 * 8 + lVar8);
                uVar14 = uVar14 + 1;
              } while (uVar15 != uVar14);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar16);
        }
        uVar6 = uVar6 + 1;
        lVar8 = lVar8 + 8;
        uVar15 = uVar15 - 1;
        uVar7 = uVar12;
        dVar19 = dVar17;
      } while (uVar12 != uVar16);
    }
    if (0 < n) {
      uVar7 = (ulong)(n - 1);
      uVar15 = uVar16;
      do {
        uVar6 = uVar15 - 1;
        if (1 < (long)uVar15) {
          uVar12 = 0;
          do {
            dVar19 = M[uVar12][uVar6];
            if ((dVar19 != 0.0) || (NAN(dVar19))) {
              B[uVar12] = B[uVar12] - dVar19 * B[uVar6];
            }
            uVar12 = uVar12 + 1;
          } while (uVar7 != uVar12);
        }
        uVar7 = uVar7 - 1;
        bVar4 = 1 < (long)uVar15;
        uVar15 = uVar6;
      } while (bVar4);
    }
    if (bFullPivot) {
      if (0 < n) {
        uVar15 = 0;
        do {
          X[*(int *)(memblock + uVar15 * 4)] = B[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar16 != uVar15);
      }
      if (memblock != local_138 && memblock != (undefined1 *)0x0) {
        onfree(memblock);
      }
    }
    else {
      memcpy(X,B,uVar16 << 3);
    }
    dVar17 = dVar17 / dVar20;
  }
  return dVar17;
}

Assistant:

double ON_SolveNxN(bool bFullPivot, bool bNormalize, int n, double* M[], double B[], double X[])
{
  if ( n <= 0 || 0 == M || 0 == B || 0 == X )
    return 0.0;

  int i,j,maxi,maxj,n0, Xdex_buffer[64];
  double x,minpivot=0.0,maxpivot=1.0,*p;
  int* Xdex = 0;
  
  if ( bNormalize )
  {
    for ( i = 0; i < n; i++ )
    {
      x = 0.0;
      for ( j = 0; j < n; j++ )
      {
        x += M[i][j]*M[i][j];
      }
      if ( x > 0.0 )
      {
        x = 1.0/sqrt(x);
        B[i] *= x;
        for ( j = 0; j < n; j++ )
          M[i][j] *= x;
      }
    }
  }

  if ( bFullPivot )
  {
    // The Xdex_buffer[] hoo haa is here to avoid an potentially time
    // consuming call to heap services when the matrix is small.
    // When n > 64 the numerical portion of the computation is 
    // long enough that the time to call onmalloc() is negligible.
    // (When n > 10-ish, this calculation is likely to return junk
    // unless you have a special case matrix, in which case this
    // function will be much slower than one that is designed to
    // takes advantage of the special case.
    Xdex = (n <= (int)((sizeof(Xdex_buffer)/sizeof(Xdex_buffer[0]))))
         ? &Xdex_buffer[0] 
         : (int*)onmalloc(n*sizeof(Xdex[0]));
    for ( i = 0; i < n; i++ )
      Xdex[i] = i;
  }

  // reduce system of equations to upper triangular
  for (n0=0; n0<n; n0++)
  {
    // find pivot = biggest entry in sub-matrix
    maxi=n0;
    maxj=n0;
    x=0.0;
    for(j=n0;j<n;j++) 
    {
      for(i=n0;i<n;i++)  
      {
        if ( fabs(M[i][j]) > x )
        {
          x=fabs(M[i][j]);
          maxi=i;
          maxj=j;
        }
      }
      if ( !bFullPivot )
        break;
    }
    if ( 0.0==x )
    {
      // system of equations is degenerate
      // Return -(rank of M) (M has rank n0)
      if ( 0 != Xdex && Xdex != &Xdex_buffer[0] )
        onfree(Xdex);
      return -n0;
    }
    else if ( 0==n0 )
    {
      minpivot=x;
      maxpivot=x;
    }
    else if (x < minpivot)
      minpivot=x;
    else if  (x > maxpivot)
      maxpivot=x;

    // put pivot in M[n0][n0]
    if ( n0 != maxi )
    {
      // swap rows n0 and maxi
      p = M[n0];M[n0]=M[maxi];M[maxi]=p;
      x=B[n0];B[n0]=B[maxi];B[maxi]=x;
    }
    if ( n0 != maxj )
    {
      // swap columns n0 and maxj
      for (i=0;i<n;i++)
      {
        x=M[i][n0];M[i][n0]=M[i][maxj];M[i][maxj]=x;
      }
      j=Xdex[n0];Xdex[n0]=Xdex[maxj];Xdex[maxj]=j;
    }

    // divide row n0 by M[n0][n0] to unitize M[n0][n0]
    x = 1.0/M[n0][n0];
    //M[n0][n0] = 1.0; // cosmetic because M[n0][n0] will never be used again
    B[n0] *= x;
    for (j=n0+1;j<n;j++) 
      M[n0][j] *= x;

    // For each i > n0, replace row[i] with
    // row[i] - M[i][n0]*row[n0] to zero out M[i>n0][n0]
    for ( i = n0+1; i < n; i++ )
    {
      x = -M[i][n0];
      if ( 0.0 != x )
      {
        //M[i][n0] = 0.0; // cosmetic because M[i][n0] will never be used again
        B[i] += x*B[n0];
        for ( j = n0+1; j < n; j++ )
        {
          M[i][j] += x*M[n0][j];
        }
      }
    }
  }

  // At this point M is upper triangular with 1's
  // on its diagonal.  Backsolve.
  for ( j = n-1; j >= 0; j-- )
  {
    for ( i = 0; i < j; i++ )
    {
      x = -M[i][j];
      if ( x != 0 )
      {
        B[i] += x*B[j];
        //M[i][j] += x; // cosmetic because M[i][j] will never be used again
      }
    }
  }

  // solution is now in B
  if ( bFullPivot )
  {
    for(i=0;i<n;i++)
      X[Xdex[i]] = B[i];

    if ( 0 != Xdex && Xdex != &Xdex_buffer[0] )
      onfree(Xdex);
  }
  else
  {
    memcpy(&X[0],&B[0],n*sizeof(X[0]));
  }

  return minpivot/maxpivot;
}